

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linkedlist_apply.c
# Opt level: O0

int test_linkedlist_apply(void)

{
  int iVar1;
  s_linkedlist *linked_list_00;
  char *pcVar2;
  char cVar3;
  uint error;
  s_linkedlist *linked_list;
  
  linked_list_00 = linkedlist_create();
  pcVar2 = strdup("apple");
  linkedlist_add_back(linked_list_00,pcVar2);
  pcVar2 = strdup("banana");
  linkedlist_add_back(linked_list_00,pcVar2);
  pcVar2 = strdup("clementine");
  linkedlist_add_back(linked_list_00,pcVar2);
  linkedlist_apply(linked_list_00,fun_applier_uppercase,(void *)0x0);
  cVar3 = linked_list_00->size != 3;
  pcVar2 = (char *)linkedlist_get(linked_list_00,0);
  iVar1 = strcmp_with_s2_nullcheck("APPLE",pcVar2);
  if (iVar1 != 0) {
    cVar3 = cVar3 + '\x01';
  }
  pcVar2 = (char *)linkedlist_get(linked_list_00,1);
  iVar1 = strcmp_with_s2_nullcheck("BANANA",pcVar2);
  if (iVar1 != 0) {
    cVar3 = cVar3 + '\x01';
  }
  pcVar2 = (char *)linkedlist_get(linked_list_00,2);
  iVar1 = strcmp_with_s2_nullcheck("CLEMENTINE",pcVar2);
  if (iVar1 != 0) {
    cVar3 = cVar3 + '\x01';
  }
  linkedlist_destroy(linked_list_00,fun_free_memory);
  return (int)(cVar3 == '\0');
}

Assistant:

int test_linkedlist_apply(void) {
    s_linkedlist *linked_list = NULL;
    unsigned int error        = 0;

    // Test
    linked_list = linkedlist_create();
    linkedlist_add_back(linked_list, strdup("apple"));
    linkedlist_add_back(linked_list, strdup("banana"));
    linkedlist_add_back(linked_list, strdup("clementine"));
    linkedlist_apply(linked_list, &fun_applier_uppercase, NULL);

    // Assert
    if (linked_list->size != 3) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("APPLE", linkedlist_get(linked_list, 0)) != 0) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("BANANA", linkedlist_get(linked_list, 1)) != 0) {
        error += 1;
    }
    if (strcmp_with_s2_nullcheck("CLEMENTINE", linkedlist_get(linked_list, 2)) != 0) {
        error += 1;
    }

    // Free allocated memory
    linkedlist_destroy(linked_list, &fun_free_memory);

    return (error == 0);
}